

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O0

bool __thiscall QPDFParser::tooManyBadTokens(QPDFParser *this)

{
  int iVar1;
  size_type sVar2;
  size_type sVar3;
  size_t sVar4;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  QPDFParser *local_18;
  QPDFParser *this_local;
  
  local_18 = this;
  sVar2 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size
                    (&this->frame->olist);
  if ((5000 < sVar2) ||
     (sVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
              ::size(&this->frame->dict), 5000 < sVar3)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,
               "encountered errors while parsing an array or dictionary with more than 5000 elements; giving up on reading object"
               ,&local_39);
    warn(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
    return true;
  }
  iVar1 = this->max_bad_count + -1;
  this->max_bad_count = iVar1;
  if ((0 < iVar1) && (4 < this->good_count)) {
    this->good_count = 0;
    this->bad_count = 1;
    return false;
  }
  iVar1 = this->bad_count + 1;
  this->bad_count = iVar1;
  if (iVar1 < 6) {
    if (this->frame->state != st_array) {
      sVar4 = QIntC::to_size<int>(&this->max_bad_count);
      sVar2 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size
                        (&this->frame->olist);
      if (sVar4 < sVar2) goto LAB_002fa5cd;
    }
    this->good_count = 0;
    return false;
  }
LAB_002fa5cd:
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"too many errors; giving up on reading object",&local_71);
  warn(this,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  return true;
}

Assistant:

bool
QPDFParser::tooManyBadTokens()
{
    if (frame->olist.size() > 5'000 || frame->dict.size() > 5'000) {
        warn(
            "encountered errors while parsing an array or dictionary with more than 5000 "
            "elements; giving up on reading object");
        return true;
    }
    if (--max_bad_count > 0 && good_count > 4) {
        good_count = 0;
        bad_count = 1;
        return false;
    }
    if (++bad_count > 5 ||
        (frame->state != st_array && QIntC::to_size(max_bad_count) < frame->olist.size())) {
        // Give up after 5 errors in close proximity or if the number of missing dictionary keys
        // exceeds the remaining number of allowable total errors.
        warn("too many errors; giving up on reading object");
        return true;
    }
    good_count = 0;
    return false;
}